

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::SelectGenericLoop<float,float,duckdb::Equals,true,true,true>
                (float *ldata,float *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  bool bVar1;
  ulong uVar2;
  idx_t iVar3;
  ulong uVar4;
  SelectionVector *pSVar5;
  ulong uVar6;
  idx_t iVar7;
  idx_t iVar8;
  idx_t iVar9;
  idx_t i;
  ulong uVar10;
  
  iVar9 = 0;
  iVar7 = 0;
  for (uVar10 = 0; count != uVar10; uVar10 = uVar10 + 1) {
    uVar6 = uVar10;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      uVar6 = (ulong)result_sel->sel_vector[uVar10];
    }
    uVar2 = uVar10;
    if (lsel->sel_vector != (sel_t *)0x0) {
      uVar2 = (ulong)lsel->sel_vector[uVar10];
    }
    uVar4 = uVar10;
    if (rsel->sel_vector != (sel_t *)0x0) {
      uVar4 = (ulong)rsel->sel_vector[uVar10];
    }
    bVar1 = duckdb::Equals::Operation<float>(ldata + uVar2,rdata + uVar4);
    if (bVar1) {
      iVar3 = iVar9;
      pSVar5 = true_sel;
      iVar8 = iVar7;
      iVar9 = iVar9 + 1;
    }
    else {
      iVar8 = iVar7 + 1;
      iVar3 = iVar7;
      pSVar5 = false_sel;
    }
    pSVar5->sel_vector[iVar3] = (sel_t)uVar6;
    iVar7 = iVar8;
  }
  return iVar9;
}

Assistant:

static inline idx_t
	SelectGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                  const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                  const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                  ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
#ifdef DUCKDB_SMALLER_BINARY
		const bool HAS_TRUE_SEL = true_sel;
		const bool HAS_FALSE_SEL = false_sel;
		const bool NO_NULL = false;
#endif
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto lindex = lsel->get_index(i);
			auto rindex = rsel->get_index(i);
			if ((NO_NULL || (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex))) &&
			    OP::Operation(ldata[lindex], rdata[rindex])) {
				if (HAS_TRUE_SEL) {
					true_sel->set_index(true_count++, result_idx);
				}
			} else {
				if (HAS_FALSE_SEL) {
					false_sel->set_index(false_count++, result_idx);
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}